

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_set_var_nentry_update_test(void)

{
  long *plVar1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  long lVar4;
  _func_void_btree_ptr_void_ptr_void_ptr *p_Var5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  bnode *__ptr;
  ushort *puVar11;
  ushort *puVar12;
  undefined2 *puVar13;
  btree_kv_ops *pbVar14;
  size_t i;
  bnode *pbVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  undefined8 *puVar19;
  long lVar20;
  bnode *__s2;
  char cVar21;
  char *pcVar22;
  ulong uVar23;
  char acStack_4e7 [310];
  char acStack_3b1 [383];
  char acStack_232 [170];
  char local_188 [40];
  undefined8 local_160;
  undefined8 auStack_158 [6];
  btree_kv_ops local_128;
  undefined1 local_a8 [8];
  timeval __test_begin;
  char *keys [6];
  undefined1 local_31 [8];
  uint8_t v;
  
  pcVar16 = (char *)auStack_158;
  lVar20 = 0;
  local_160 = 0x1030d8;
  gettimeofday((timeval *)local_a8,(__timezone_ptr_t)0x0);
  local_160 = 0x1030dd;
  memleak_start();
  __test_begin.tv_usec = (long)"longstring" + 4;
  local_160 = 0x103111;
  sVar10 = strlen("string");
  local_160 = 0x10311e;
  __ptr = (bnode *)malloc(0x1010);
  __ptr->kvsize = 0;
  __ptr->flag = 0;
  __ptr->level = 0;
  __ptr->nentry = 0;
  (__ptr->field_4).data = (void *)0x0;
  __ptr->kvsize = (short)((int)sVar10 << 8) + 0x301;
  __ptr->level = 1;
  __ptr->nentry = 6;
  (__ptr->field_4).data = __ptr + 1;
  local_31[0] = 100;
  local_160 = 0x103159;
  btree_str_kv_get_kb64_vb64(&local_128);
  pbVar15 = (bnode *)0x0;
  pcVar18 = (char *)0x0;
  do {
    pcVar17 = *(char **)((long)keys + lVar20 + -8);
    local_160 = 0x10316e;
    sVar10 = strlen(pcVar17);
    uVar7 = (int)sVar10 + 1;
    uVar23 = (ulong)(uVar7 & 0xffff);
    local_160 = 0x103190;
    puVar11 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar7;
    *puVar11 = uVar6 << 8 | uVar6 >> 8;
    local_160 = 0x1031ad;
    memcpy(puVar11 + 1,pcVar17,uVar23);
    *(undefined8 *)((long)auStack_158 + lVar20) = puVar11;
    local_160 = 0x1031c8;
    (*local_128.set_kv)(__ptr,(idx_t)pbVar15,(undefined8 *)((long)auStack_158 + lVar20),local_31);
    local_160 = 0x1031dc;
    iVar8 = strcmp((char *)((long)(__ptr->field_4).data + (long)pcVar18) + 2,pcVar17);
    if (iVar8 != 0) {
      local_160 = 0x1033e9;
      kv_set_var_nentry_update_test();
      __s2 = __ptr;
      goto LAB_001033e9;
    }
    local_160 = 0x1031ec;
    sVar10 = strlen(pcVar17);
    pcVar18 = pcVar18 + sVar10 + 4;
    pbVar15 = (bnode *)(ulong)((int)pbVar15 + 1);
    lVar20 = lVar20 + 8;
  } while (lVar20 != 0x30);
  lVar20 = 0;
  do {
    local_160 = 0x103216;
    free((void *)auStack_158[lVar20]);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 6);
  pcVar16 = local_188;
  puVar11 = (ushort *)0x0;
  uVar7 = 0;
  __s2 = (bnode *)0x0;
  do {
    pcVar18 = *(char **)((long)&__test_begin.tv_usec + (long)puVar11);
    sVar10 = strlen(pcVar18);
    uVar9 = (int)sVar10 + 1;
    uVar23 = (ulong)(uVar9 & 0xffff);
    puVar12 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar9;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    pcVar17 = (char *)(ulong)uVar7;
    memcpy(puVar12 + 1,pcVar18,uVar23);
    *(ushort **)(pcVar16 + (long)puVar11) = puVar12;
    (*local_128.set_kv)(__ptr,(idx_t)uVar7,pcVar16 + (long)puVar11,local_31);
    iVar8 = strcmp((char *)((long)(__ptr->field_4).data + (long)__s2) + 2,pcVar18);
    pbVar15 = __ptr;
    if (iVar8 != 0) goto LAB_001033e9;
    sVar10 = strlen(pcVar18);
    __s2 = (bnode *)((long)&__s2->level + sVar10);
    uVar7 = uVar7 + 1;
    puVar11 = puVar11 + 4;
  } while (puVar11 != (ushort *)0x30);
  (*local_128.set_kv)(__ptr,3,pcVar16,local_31);
  puVar11 = (ushort *)0x0;
  (*local_128.set_kv)(__ptr,0,&local_160,local_31);
  __test_begin.tv_usec = (__suseconds_t)anon_var_dwarf_fa0;
  (*local_128.set_kv)(__ptr,5,pcVar16,local_31);
  pbVar15 = (bnode *)((__ptr->field_4).dummy + 2);
  pcVar17 = (char *)0x0;
  while( true ) {
    __s2 = (bnode *)keys[(long)puVar11 + -1];
    iVar8 = strcmp(pcVar17 + (long)&pbVar15->kvsize,(char *)__s2);
    pcVar18 = pcVar16;
    if (iVar8 != 0) break;
    sVar10 = strlen((char *)__s2);
    pcVar17 = pcVar17 + sVar10 + 4;
    puVar11 = (ushort *)((long)puVar11 + 1);
    if (puVar11 == (ushort *)0x6) {
      free(__ptr);
      lVar20 = 0;
      do {
        free(*(void **)(pcVar16 + lVar20 * 8));
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_set_var_nentry_update_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar18,"kv_set_var_nentry_update_test");
      return;
    }
  }
LAB_001033ee:
  *(code **)(pcVar16 + -8) = kv_get_var_test;
  kv_set_var_nentry_update_test();
  *(undefined1 **)(pcVar16 + -8) = &stack0xfffffffffffffff8;
  *(ushort **)(pcVar16 + -0x10) = puVar11;
  *(bnode **)(pcVar16 + -0x18) = __s2;
  *(char **)(pcVar16 + -0x20) = pcVar18;
  *(char **)(pcVar16 + -0x28) = pcVar17;
  *(bnode **)(pcVar16 + -0x30) = pbVar15;
  pcVar16[-0x80] = '\r';
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x40),(__timezone_ptr_t)0x0);
  pcVar16[-0x80] = '\x12';
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  memleak_start();
  pcVar16[-0x80] = '\x1c';
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  puVar13 = (undefined2 *)malloc(0xd);
  *puVar13 = 0xb00;
  *(undefined8 *)(puVar13 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar13 + 9) = 0x676e69;
  pcVar22 = "teststring";
  pcVar18 = pcVar16 + -0x60;
  *(undefined2 **)pcVar18 = puVar13;
  pcVar16[-0x80] = 'P';
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  pbVar15 = (bnode *)malloc(0x1010);
  pbVar15->kvsize = 0;
  pbVar15->flag = 0;
  pbVar15->level = 0;
  pbVar15->nentry = 0;
  (pbVar15->field_4).data = (void *)0x0;
  pbVar15->kvsize = 0xd08;
  pbVar15->level = 1;
  (pbVar15->field_4).data = pbVar15 + 1;
  pcVar17 = pcVar16 + -0x70;
  pcVar17[0] = '\x14';
  pcVar17[1] = '\0';
  pcVar17[2] = '\0';
  pcVar17[3] = '\0';
  pcVar17[4] = '\0';
  pcVar17[5] = '\0';
  pcVar17[6] = '\0';
  pcVar17[7] = '\0';
  plVar1 = (long *)(pcVar16 + -0x68);
  *plVar1 = 0;
  pcVar16[-0x80] = -0x73;
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  pbVar14 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var2 = pbVar14->set_kv;
  pcVar16[-0x80] = -0x62;
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  (*p_Var2)(pbVar15,0,pcVar18,pcVar17);
  p_Var2 = pbVar14->get_kv;
  pcVar16[-0x80] = -0x54;
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  (*p_Var2)(pbVar15,0,plVar1,pcVar16 + -0x78);
  pcVar16[-0x80] = -0x44;
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  iVar8 = strcmp((char *)(*plVar1 + 2),"teststring");
  if (iVar8 == 0) {
    if (*(long *)(pcVar16 + -0x78) != *(long *)(pcVar16 + -0x70)) goto LAB_001035c7;
    pcVar22 = pcVar16 + -0x68;
    p_Var2 = pbVar14->get_kv;
    pcVar16[-0x80] = -0x1a;
    pcVar16[-0x7f] = '4';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    (*p_Var2)(pbVar15,0,pcVar22,pcVar16 + -0x78);
    pcVar16[-0x80] = -7;
    pcVar16[-0x7f] = '4';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    iVar8 = strcmp((char *)(*(long *)pcVar22 + 2),"teststring");
    if (iVar8 != 0) goto LAB_001035cc;
    if (*(long *)(pcVar16 + -0x78) != *(long *)(pcVar16 + -0x70)) goto LAB_001035d1;
    p_Var2 = pbVar14->get_kv;
    builtin_strncpy(pcVar16 + -0x80,"\"5\x10",4);
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    (*p_Var2)(pbVar15,0,pcVar16 + -0x68,(void *)0x0);
    pcVar22 = *(char **)(pcVar16 + -0x68);
    builtin_strncpy(pcVar16 + -0x80,"55\x10",4);
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    iVar8 = strcmp((char *)((long)pcVar22 + 2),"teststring");
    if (iVar8 != 0) goto LAB_001035d6;
    if (*(long *)(pcVar16 + -0x78) == *(long *)(pcVar16 + -0x70)) {
      pcVar16[-0x80] = 'T';
      pcVar16[-0x7f] = '5';
      pcVar16[-0x7e] = '\x10';
      pcVar16[-0x7d] = '\0';
      pcVar16[-0x7c] = '\0';
      pcVar16[-0x7b] = '\0';
      pcVar16[-0x7a] = '\0';
      pcVar16[-0x79] = '\0';
      free(pbVar15);
      *(btree_kv_ops **)(pcVar16 + -0x58) = pbVar14;
      *(undefined8 *)(pcVar16 + -0x50) = *(undefined8 *)(pcVar16 + -0x60);
      *(char **)(pcVar16 + -0x48) = pcVar22;
      lVar20 = 0;
      do {
        pvVar3 = *(void **)(pcVar16 + lVar20 * 8 + -0x58);
        builtin_strncpy(pcVar16 + -0x80,"t5\x10",4);
        pcVar16[-0x7c] = '\0';
        pcVar16[-0x7b] = '\0';
        pcVar16[-0x7a] = '\0';
        pcVar16[-0x79] = '\0';
        free(pvVar3);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      pcVar16[-0x80] = -0x7e;
      pcVar16[-0x7f] = '5';
      pcVar16[-0x7e] = '\x10';
      pcVar16[-0x7d] = '\0';
      pcVar16[-0x7c] = '\0';
      pcVar16[-0x7b] = '\0';
      pcVar16[-0x7a] = '\0';
      pcVar16[-0x79] = '\0';
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_get_var_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcVar16[-0x80] = -0x4d;
      pcVar16[-0x7f] = '5';
      pcVar16[-0x7e] = '\x10';
      pcVar16[-0x7d] = '\0';
      pcVar16[-0x7c] = '\0';
      pcVar16[-0x7b] = '\0';
      pcVar16[-0x7a] = '\0';
      pcVar16[-0x79] = '\0';
      fprintf(_stderr,pcVar18,"kv_get_var_test");
      return;
    }
  }
  else {
    pcVar16[-0x80] = -0x39;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
LAB_001035c7:
    pcVar16[-0x80] = -0x34;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
LAB_001035cc:
    pcVar16[-0x80] = -0x2f;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
LAB_001035d1:
    pcVar16[-0x80] = -0x2a;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
LAB_001035d6:
    pcVar16[-0x80] = -0x25;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
  }
  *(code **)(pcVar16 + -0x80) = kv_get_var_nentry_test;
  kv_get_var_test();
  *(long **)(pcVar16 + -0x80) = plVar1;
  *(char **)(pcVar16 + -0x88) = pcVar22;
  *(btree_kv_ops **)(pcVar16 + -0x90) = pbVar14;
  *(char **)(pcVar16 + -0x98) = pcVar17;
  *(char **)(pcVar16 + -0xa0) = pcVar18;
  *(bnode **)(pcVar16 + -0xa8) = pbVar15;
  lVar20 = 0;
  pcVar16[-0x118] = '\x02';
  pcVar16[-0x117] = '6';
  pcVar16[-0x116] = '\x10';
  pcVar16[-0x115] = '\0';
  pcVar16[-0x114] = '\0';
  pcVar16[-0x113] = '\0';
  pcVar16[-0x112] = '\0';
  pcVar16[-0x111] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x110),(__timezone_ptr_t)0x0);
  pcVar16[-0x118] = '\a';
  pcVar16[-0x117] = '6';
  pcVar16[-0x116] = '\x10';
  pcVar16[-0x115] = '\0';
  pcVar16[-0x114] = '\0';
  pcVar16[-0x113] = '\0';
  pcVar16[-0x112] = '\0';
  pcVar16[-0x111] = '\0';
  memleak_start();
  pcVar16[-0xb8] = '\0';
  pcVar16[-0xb7] = '\0';
  pcVar16[-0xb6] = '\0';
  pcVar16[-0xb5] = '\0';
  pcVar16[-0xb4] = '\0';
  pcVar16[-0xb3] = '\0';
  pcVar16[-0xb2] = '\0';
  pcVar16[-0xb1] = '\0';
  puVar19 = &DAT_00109d70;
  do {
    pcVar18 = *(char **)((long)&DAT_00109d70 + lVar20);
    builtin_strncpy(pcVar16 + -0x118,"\"6\x10",4);
    pcVar16[-0x114] = '\0';
    pcVar16[-0x113] = '\0';
    pcVar16[-0x112] = '\0';
    pcVar16[-0x111] = '\0';
    sVar10 = strlen(pcVar18);
    uVar7 = (int)sVar10 + 1;
    uVar23 = (ulong)(uVar7 & 0xffff);
    builtin_strncpy(pcVar16 + -0x118,"16\x10",4);
    pcVar16[-0x114] = '\0';
    pcVar16[-0x113] = '\0';
    pcVar16[-0x112] = '\0';
    pcVar16[-0x111] = '\0';
    puVar11 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar7;
    *puVar11 = uVar6 << 8 | uVar6 >> 8;
    builtin_strncpy(pcVar16 + -0x118,"N6\x10",4);
    pcVar16[-0x114] = '\0';
    pcVar16[-0x113] = '\0';
    pcVar16[-0x112] = '\0';
    pcVar16[-0x111] = '\0';
    memcpy(puVar11 + 1,pcVar18,uVar23);
    *(ushort **)(pcVar16 + lVar20 + -0x100) = puVar11;
    lVar20 = lVar20 + 8;
  } while (lVar20 != 0x30);
  pcVar16[-0x118] = 'g';
  pcVar16[-0x117] = '6';
  pcVar16[-0x116] = '\x10';
  pcVar16[-0x115] = '\0';
  pcVar16[-0x114] = '\0';
  pcVar16[-0x113] = '\0';
  pcVar16[-0x112] = '\0';
  pcVar16[-0x111] = '\0';
  pbVar15 = (bnode *)malloc(0x1010);
  pbVar15->kvsize = 0;
  pbVar15->flag = 0;
  pbVar15->level = 0;
  pbVar15->nentry = 0;
  (pbVar15->field_4).data = (void *)0x0;
  pbVar15->kvsize = 0x901;
  pbVar15->level = 1;
  pbVar15->nentry = 6;
  (pbVar15->field_4).data = pbVar15 + 1;
  pcVar16[-0xa9] = 'd';
  pbVar14 = (btree_kv_ops *)(pcVar16 + -400);
  pcVar16[-0x198] = -99;
  pcVar16[-0x197] = '6';
  pcVar16[-0x196] = '\x10';
  pcVar16[-0x195] = '\0';
  pcVar16[-0x194] = '\0';
  pcVar16[-0x193] = '\0';
  pcVar16[-0x192] = '\0';
  pcVar16[-0x191] = '\0';
  btree_str_kv_get_kb64_vb64(pbVar14);
  pcVar18 = pcVar16 + -0x100;
  uVar23 = 0;
  do {
    pcVar16[-0x198] = -0x4a;
    pcVar16[-0x197] = '6';
    pcVar16[-0x196] = '\x10';
    pcVar16[-0x195] = '\0';
    pcVar16[-0x194] = '\0';
    pcVar16[-0x193] = '\0';
    pcVar16[-0x192] = '\0';
    pcVar16[-0x191] = '\0';
    (**(code **)(pcVar16 + -0x188))(pbVar15,uVar23 & 0xffff,pcVar18,pcVar16 + -0xa9);
    pcVar16[-0xa9] = pcVar16[-0xa9] + '\x01';
    uVar23 = uVar23 + 1;
    pcVar18 = pcVar18 + 8;
  } while (uVar23 != 6);
  pcVar16[-0xa9] = 'd';
  lVar20 = 0;
  while( true ) {
    p_Var2 = pbVar14->get_kv;
    pcVar16[-0x198] = -0x1e;
    pcVar16[-0x197] = '6';
    pcVar16[-0x196] = '\x10';
    pcVar16[-0x195] = '\0';
    pcVar16[-0x194] = '\0';
    pcVar16[-0x193] = '\0';
    pcVar16[-0x192] = '\0';
    pcVar16[-0x191] = '\0';
    (*p_Var2)(pbVar15,(idx_t)lVar20,pcVar16 + -0xb8,pcVar16 + -0xaa);
    pcVar18 = (char *)*puVar19;
    pcVar16[-0x198] = -0xd;
    pcVar16[-0x197] = '6';
    pcVar16[-0x196] = '\x10';
    pcVar16[-0x195] = '\0';
    pcVar16[-0x194] = '\0';
    pcVar16[-0x193] = '\0';
    pcVar16[-0x192] = '\0';
    pcVar16[-0x191] = '\0';
    iVar8 = strcmp((char *)(*(long *)(pcVar16 + -0xb8) + 2),pcVar18);
    if (iVar8 != 0) break;
    if (pcVar16[-0xaa] != pcVar16[-0xa9]) {
      pcVar16[-0x198] = -0x67;
      pcVar16[-0x197] = '7';
      pcVar16[-0x196] = '\x10';
      pcVar16[-0x195] = '\0';
      pcVar16[-0x194] = '\0';
      pcVar16[-0x193] = '\0';
      pcVar16[-0x192] = '\0';
      pcVar16[-0x191] = '\0';
      kv_get_var_nentry_test();
      break;
    }
    pcVar16[-0xa9] = pcVar16[-0xa9] + '\x01';
    lVar20 = lVar20 + 1;
    puVar19 = puVar19 + 1;
    if (lVar20 == 6) {
      *(bnode **)(pcVar16 + -0xd0) = pbVar15;
      *(undefined8 *)(pcVar16 + -200) = *(undefined8 *)(pcVar16 + -0xb8);
      lVar20 = 0;
      do {
        pvVar3 = *(void **)(pcVar16 + lVar20 * 8 + -0xd0);
        builtin_strncpy(pcVar16 + -0x198,"17\x10",4);
        pcVar16[-0x194] = '\0';
        pcVar16[-0x193] = '\0';
        pcVar16[-0x192] = '\0';
        pcVar16[-0x191] = '\0';
        free(pvVar3);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 2);
      lVar20 = 0;
      do {
        pvVar3 = *(void **)(pcVar16 + lVar20 * 8 + -0x100);
        builtin_strncpy(pcVar16 + -0x198,"F7\x10",4);
        pcVar16[-0x194] = '\0';
        pcVar16[-0x193] = '\0';
        pcVar16[-0x192] = '\0';
        pcVar16[-0x191] = '\0';
        free(pvVar3);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      builtin_strncpy(pcVar16 + -0x198,"T7\x10",4);
      pcVar16[-0x194] = '\0';
      pcVar16[-0x193] = '\0';
      pcVar16[-0x192] = '\0';
      pcVar16[-0x191] = '\0';
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_get_var_nentry_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcVar16[-0x198] = -0x7b;
      pcVar16[-0x197] = '7';
      pcVar16[-0x196] = '\x10';
      pcVar16[-0x195] = '\0';
      pcVar16[-0x194] = '\0';
      pcVar16[-0x193] = '\0';
      pcVar16[-0x192] = '\0';
      pcVar16[-0x191] = '\0';
      fprintf(_stderr,pcVar18,"kv_get_var_nentry_test");
      return;
    }
  }
  *(code **)(pcVar16 + -0x198) = kv_ins_var;
  kv_get_var_nentry_test();
  *(char **)(pcVar16 + -0x198) = pcVar16 + -0x80;
  *(long *)(pcVar16 + -0x1a0) = lVar20;
  *(btree_kv_ops **)(pcVar16 + -0x1a8) = pbVar14;
  *(undefined8 **)(pcVar16 + -0x1b0) = puVar19;
  *(char **)(pcVar16 + -0x1b8) = pcVar16 + -0xaa;
  *(bnode **)(pcVar16 + -0x1c0) = pbVar15;
  pcVar16[-0x200] = -0x48;
  pcVar16[-0x1ff] = '7';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x1d0),(__timezone_ptr_t)0x0);
  pcVar16[-0x200] = -0x43;
  pcVar16[-0x1ff] = '7';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  memleak_start();
  pcVar16[-0x200] = -0x39;
  pcVar16[-0x1ff] = '7';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  puVar13 = (undefined2 *)malloc(0xd);
  *puVar13 = 0xb00;
  *(undefined8 *)(puVar13 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar13 + 9) = 0x676e69;
  pcVar18 = pcVar16 + -0x1d8;
  *(undefined2 **)pcVar18 = puVar13;
  pcVar16[-0x200] = -5;
  pcVar16[-0x1ff] = '7';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  pbVar15 = (bnode *)malloc(0x1010);
  pbVar15->kvsize = 0;
  pbVar15->flag = 0;
  pbVar15->level = 0;
  pbVar15->nentry = 0;
  (pbVar15->field_4).data = (void *)0x0;
  pbVar15->kvsize = 0xd08;
  pbVar15->level = 1;
  (pbVar15->field_4).data = pbVar15 + 1;
  pcVar17 = pcVar16 + -0x1e8;
  pcVar17[0] = '\x14';
  pcVar17[1] = '\0';
  pcVar17[2] = '\0';
  pcVar17[3] = '\0';
  pcVar17[4] = '\0';
  pcVar17[5] = '\0';
  pcVar17[6] = '\0';
  pcVar17[7] = '\0';
  plVar1 = (long *)(pcVar16 + -0x1e0);
  *plVar1 = 0;
  pcVar16[-0x200] = '8';
  pcVar16[-0x1ff] = '8';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  pbVar14 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var2 = pbVar14->ins_kv;
  pcVar16[-0x200] = 'I';
  pcVar16[-0x1ff] = '8';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  (*p_Var2)(pbVar15,0,pcVar18,pcVar17);
  p_Var2 = pbVar14->get_kv;
  pcVar16[-0x200] = 'Y';
  pcVar16[-0x1ff] = '8';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  (*p_Var2)(pbVar15,0,plVar1,pcVar16 + -0x1f0);
  pcVar16[-0x200] = 'i';
  pcVar16[-0x1ff] = '8';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  iVar8 = strcmp((char *)(*plVar1 + 2),"teststring");
  if (iVar8 == 0) {
    if (*(long *)(pcVar16 + -0x1f0) == *(long *)(pcVar16 + -0x1e8)) {
      pcVar16[-0x200] = -0x7f;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      free(pbVar15);
      pcVar16[-0x200] = -0x77;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      free(pbVar14);
      pcVar16[-0x200] = -0x6d;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      free(*(void **)(pcVar16 + -0x1d8));
      pcVar16[-0x200] = -99;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      free(*(void **)(pcVar16 + -0x1e0));
      pcVar16[-0x200] = -0x5e;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_ins_var()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcVar16[-0x200] = -0x2d;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      fprintf(_stderr,pcVar18,"kv_ins_var");
      return;
    }
  }
  else {
    pcVar16[-0x200] = -0x19;
    pcVar16[-0x1ff] = '8';
    pcVar16[-0x1fe] = '\x10';
    pcVar16[-0x1fd] = '\0';
    pcVar16[-0x1fc] = '\0';
    pcVar16[-0x1fb] = '\0';
    pcVar16[-0x1fa] = '\0';
    pcVar16[-0x1f9] = '\0';
    kv_ins_var();
  }
  *(code **)(pcVar16 + -0x200) = kv_ins_var_nentry_test;
  kv_ins_var();
  *(long **)(pcVar16 + -0x200) = plVar1;
  *(btree_kv_ops **)(pcVar16 + -0x208) = pbVar14;
  *(char **)(pcVar16 + -0x210) = "teststring";
  *(char **)(pcVar16 + -0x218) = pcVar17;
  *(char **)(pcVar16 + -0x220) = pcVar18;
  *(bnode **)(pcVar16 + -0x228) = pbVar15;
  pcVar18 = pcVar16 + -0x250;
  lVar20 = 0;
  pcVar16[-600] = '\v';
  pcVar16[-599] = '9';
  pcVar16[-0x256] = '\x10';
  pcVar16[-0x255] = '\0';
  pcVar16[-0x254] = '\0';
  pcVar16[-0x253] = '\0';
  pcVar16[-0x252] = '\0';
  pcVar16[-0x251] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x250),(__timezone_ptr_t)0x0);
  pcVar16[-600] = '\x10';
  pcVar16[-599] = '9';
  pcVar16[-0x256] = '\x10';
  pcVar16[-0x255] = '\0';
  pcVar16[-0x254] = '\0';
  pcVar16[-0x253] = '\0';
  pcVar16[-0x252] = '\0';
  pcVar16[-0x251] = '\0';
  memleak_start();
  do {
    pcVar17 = *(char **)((long)&DAT_00109d60 + lVar20);
    builtin_strncpy(pcVar16 + -600,"#9\x10",4);
    pcVar16[-0x254] = '\0';
    pcVar16[-0x253] = '\0';
    pcVar16[-0x252] = '\0';
    pcVar16[-0x251] = '\0';
    sVar10 = strlen(pcVar17);
    uVar7 = (int)sVar10 + 1;
    uVar23 = (ulong)(uVar7 & 0xffff);
    builtin_strncpy(pcVar16 + -600,"29\x10",4);
    pcVar16[-0x254] = '\0';
    pcVar16[-0x253] = '\0';
    pcVar16[-0x252] = '\0';
    pcVar16[-0x251] = '\0';
    puVar11 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar7;
    *puVar11 = uVar6 << 8 | uVar6 >> 8;
    builtin_strncpy(pcVar16 + -600,"O9\x10",4);
    pcVar16[-0x254] = '\0';
    pcVar16[-0x253] = '\0';
    pcVar16[-0x252] = '\0';
    pcVar16[-0x251] = '\0';
    memcpy(puVar11 + 1,pcVar17,uVar23);
    *(ushort **)(pcVar16 + lVar20 + -0x240) = puVar11;
    lVar20 = lVar20 + 8;
  } while (lVar20 == 8);
  pcVar16[-600] = 'h';
  pcVar16[-599] = '9';
  pcVar16[-0x256] = '\x10';
  pcVar16[-0x255] = '\0';
  pcVar16[-0x254] = '\0';
  pcVar16[-0x253] = '\0';
  pcVar16[-0x252] = '\0';
  pcVar16[-0x251] = '\0';
  puVar19 = (undefined8 *)malloc(0x1010);
  *puVar19 = 0;
  puVar19[1] = 0;
  *(undefined2 *)puVar19 = 0x901;
  *(undefined4 *)((long)puVar19 + 4) = 0x20001;
  puVar19[1] = puVar19 + 2;
  pcVar17 = pcVar16 + -0x229;
  *pcVar17 = 'd';
  pcVar16[-0x2d8] = -100;
  pcVar16[-0x2d7] = '9';
  pcVar16[-0x2d6] = '\x10';
  pcVar16[-0x2d5] = '\0';
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  btree_str_kv_get_kb64_vb64((btree_kv_ops *)(pcVar16 + -0x2d0));
  pcVar16[-0x2d8] = -0x54;
  pcVar16[-0x2d7] = '9';
  pcVar16[-0x2d6] = '\x10';
  pcVar16[-0x2d5] = '\0';
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  (**(code **)(pcVar16 + -0x2c0))(puVar19,0,pcVar16 + -0x240,pcVar17);
  *pcVar17 = *pcVar17 + '\x01';
  pcVar16[-0x2d8] = -0x41;
  pcVar16[-0x2d7] = '9';
  pcVar16[-0x2d6] = '\x10';
  pcVar16[-0x2d5] = '\0';
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  (**(code **)(pcVar16 + -0x2c0))(puVar19,0,pcVar16 + -0x238,pcVar17);
  lVar4 = puVar19[1];
  pcVar16[-0x2d8] = -0x2d;
  pcVar16[-0x2d7] = '9';
  pcVar16[-0x2d6] = '\x10';
  pcVar16[-0x2d5] = '\0';
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  iVar8 = strcmp((char *)(lVar4 + 2),"longstring");
  if (iVar8 == 0) {
    cVar21 = pcVar16[-0x229];
    pcVar18 = (char *)CONCAT71((int7)((ulong)(pcVar16 + -0x250) >> 8),cVar21);
    if (*(char *)(lVar4 + 0xd) != cVar21) goto LAB_00103a2a;
    cVar21 = cVar21 + -1;
    pcVar18 = (char *)CONCAT71((int7)((ulong)(pcVar16 + -0x250) >> 8),cVar21);
    pcVar16[-0x229] = cVar21;
    pcVar16[-0x2d8] = -8;
    pcVar16[-0x2d7] = '9';
    pcVar16[-0x2d6] = '\x10';
    pcVar16[-0x2d5] = '\0';
    pcVar16[-0x2d4] = '\0';
    pcVar16[-0x2d3] = '\0';
    pcVar16[-0x2d2] = '\0';
    pcVar16[-0x2d1] = '\0';
    iVar8 = strcmp((char *)(lVar4 + 0x10),"string");
    if (iVar8 == 0) {
      if (*(char *)(lVar4 + 0x17) == cVar21) {
        builtin_strncpy(pcVar16 + -0x2d8,"\x16:\x10",4);
        pcVar16[-0x2d4] = '\0';
        pcVar16[-0x2d3] = '\0';
        pcVar16[-0x2d2] = '\0';
        pcVar16[-0x2d1] = '\0';
        kv_ins_var_nentry_test();
        return;
      }
      goto LAB_00103a34;
    }
  }
  else {
    builtin_strncpy(pcVar16 + -0x2d8,"*:\x10",4);
    pcVar16[-0x2d4] = '\0';
    pcVar16[-0x2d3] = '\0';
    pcVar16[-0x2d2] = '\0';
    pcVar16[-0x2d1] = '\0';
    kv_ins_var_nentry_test();
LAB_00103a2a:
    builtin_strncpy(pcVar16 + -0x2d8,"/:\x10",4);
    pcVar16[-0x2d4] = '\0';
    pcVar16[-0x2d3] = '\0';
    pcVar16[-0x2d2] = '\0';
    pcVar16[-0x2d1] = '\0';
    kv_ins_var_nentry_test();
  }
  builtin_strncpy(pcVar16 + -0x2d8,"4:\x10",4);
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  kv_ins_var_nentry_test();
LAB_00103a34:
  *(code **)(pcVar16 + -0x2d8) = kv_set_str_key_test;
  kv_ins_var_nentry_test();
  *(char **)(pcVar16 + -0x2d8) = pcVar18;
  *(long *)(pcVar16 + -0x2e0) = lVar4;
  *(undefined8 **)(pcVar16 + -0x2e8) = puVar19;
  pcVar16[-0x310] = 'N';
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x2f8),(__timezone_ptr_t)0x0);
  pcVar16[-0x310] = 'S';
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  memleak_start();
  pcVar16[-0x308] = '\0';
  pcVar16[-0x307] = '\0';
  pcVar16[-0x306] = '\0';
  pcVar16[-0x305] = '\0';
  pcVar16[-0x304] = '\0';
  pcVar16[-0x303] = '\0';
  pcVar16[-0x302] = '\0';
  pcVar16[-0x301] = '\0';
  pcVar16[-0x310] = 'd';
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  pbVar14 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  pcVar16[-0x310] = 'q';
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  puVar13 = (undefined2 *)malloc(0xd);
  *puVar13 = 0xb00;
  *(undefined8 *)(puVar13 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar13 + 9) = 0x676e69;
  pcVar18 = "teststring";
  *(undefined2 **)(pcVar16 + -0x300) = puVar13;
  p_Var5 = pbVar14->set_key;
  pcVar16[-0x310] = -0x5e;
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  (*p_Var5)((btree *)0x0,pcVar16 + -0x308,pcVar16 + -0x300);
  pcVar17 = *(char **)(pcVar16 + -0x308);
  pcVar16[-0x310] = -0x4f;
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  iVar8 = strcmp(pcVar17 + 2,"teststring");
  if (iVar8 == 0) {
    pcVar16[-0x310] = -0x43;
    pcVar16[-0x30f] = ':';
    pcVar16[-0x30e] = '\x10';
    pcVar16[-0x30d] = '\0';
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    free(pcVar17);
    pcVar16[-0x310] = -0x39;
    pcVar16[-0x30f] = ':';
    pcVar16[-0x30e] = '\x10';
    pcVar16[-0x30d] = '\0';
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    puVar13 = (undefined2 *)malloc(0x15);
    *puVar13 = 0x1300;
    pcVar18 = (char *)(puVar13 + 1);
    pcVar18[0] = 'u';
    pcVar18[1] = 'p';
    pcVar18[2] = 'd';
    pcVar18[3] = 'a';
    pcVar18[4] = 't';
    pcVar18[5] = 'e';
    pcVar18[6] = 'd';
    pcVar18[7] = ' ';
    pcVar18 = (char *)(puVar13 + 5);
    pcVar18[0] = 't';
    pcVar18[1] = 'e';
    pcVar18[2] = 's';
    pcVar18[3] = 't';
    pcVar18[4] = 's';
    pcVar18[5] = 't';
    pcVar18[6] = 'r';
    pcVar18[7] = 'i';
    *(undefined4 *)((long)puVar13 + 0x11) = 0x676e69;
    pcVar17 = "updated teststring";
    *(undefined2 **)(pcVar16 + -0x308) = puVar13;
    pcVar18 = pcVar16 + -0x300;
    p_Var5 = pbVar14->set_key;
    pcVar16[-0x310] = -8;
    pcVar16[-0x30f] = ':';
    pcVar16[-0x30e] = '\x10';
    pcVar16[-0x30d] = '\0';
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    (*p_Var5)((btree *)0x0,pcVar18,pcVar16 + -0x308);
    pcVar16[-0x310] = '\a';
    pcVar16[-0x30f] = ';';
    pcVar16[-0x30e] = '\x10';
    pcVar16[-0x30d] = '\0';
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    iVar8 = strcmp((char *)(*(long *)pcVar18 + 2),"updated teststring");
    if (iVar8 == 0) {
      builtin_strncpy(pcVar16 + -0x310," ;\x10",4);
      pcVar16[-0x30c] = '\0';
      pcVar16[-0x30b] = '\0';
      pcVar16[-0x30a] = '\0';
      pcVar16[-0x309] = '\0';
      kv_set_str_key_test();
      return;
    }
  }
  else {
    builtin_strncpy(pcVar16 + -0x310,"/;\x10",4);
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    kv_set_str_key_test();
  }
  *(code **)(pcVar16 + -0x310) = kv_set_str_value_test;
  kv_set_str_key_test();
  *(char **)(pcVar16 + -0x310) = pcVar18;
  *(char **)(pcVar16 + -0x318) = pcVar17;
  *(long *)(pcVar16 + -800) = lVar20;
  *(btree_kv_ops **)(pcVar16 + -0x328) = pbVar14;
  pcVar16[-0x388] = 'K';
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x370),(__timezone_ptr_t)0x0);
  pcVar16[-0x388] = 'P';
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  memleak_start();
  pcVar16[-0x380] = 'd';
  pcVar16[-0x37f] = '\0';
  pcVar16[-0x37e] = '\0';
  pcVar16[-0x37d] = '\0';
  pcVar16[-0x37c] = '\0';
  pcVar16[-0x37b] = '\0';
  pcVar16[-0x37a] = '\0';
  pcVar16[-0x379] = '\0';
  pcVar16[-0x35f] = '\b';
  pcVar16[-0x388] = 'k';
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  pbVar14 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var5 = pbVar14->set_value;
  pcVar16[-0x388] = '\x7f';
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  (*p_Var5)((btree *)(pcVar16 + -0x360),pcVar16 + -0x380,pcVar16 + -0x378);
  if (*(long *)(pcVar16 + -0x380) != *(long *)(pcVar16 + -0x378)) {
    pcVar16[-0x388] = -0x6b;
    pcVar16[-0x387] = ';';
    pcVar16[-0x386] = '\x10';
    pcVar16[-0x385] = '\0';
    pcVar16[-900] = '\0';
    pcVar16[-899] = '\0';
    pcVar16[-0x382] = '\0';
    pcVar16[-0x381] = '\0';
    kv_set_str_value_test();
  }
  plVar1 = (long *)(pcVar16 + -0x378);
  *plVar1 = 200;
  p_Var5 = pbVar14->set_value;
  pcVar16[-0x388] = -0x4e;
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  (*p_Var5)((btree *)(pcVar16 + -0x360),plVar1,pcVar16 + -0x380);
  if (*(long *)(pcVar16 + -0x380) != *plVar1) {
    pcVar16[-0x388] = -0x39;
    pcVar16[-0x387] = ';';
    pcVar16[-0x386] = '\x10';
    pcVar16[-0x385] = '\0';
    pcVar16[-900] = '\0';
    pcVar16[-899] = '\0';
    pcVar16[-0x382] = '\0';
    pcVar16[-0x381] = '\0';
    kv_set_str_value_test();
  }
  pcVar16[-0x388] = -0x31;
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  free(pbVar14);
  pcVar16[-0x388] = -0x2c;
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  memleak_end();
  pcVar18 = "%s PASSED\n";
  if (kv_set_str_value_test()::__test_pass != '\0') {
    pcVar18 = "%s FAILED\n";
  }
  builtin_strncpy(pcVar16 + -0x388,"\x05<\x10",4);
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  fprintf(_stderr,pcVar18,"kv_set_str_value_test");
  return;
LAB_001033e9:
  pcVar16[-8] = -0x12;
  pcVar16[-7] = '3';
  pcVar16[-6] = '\x10';
  pcVar16[-5] = '\0';
  pcVar16[-4] = '\0';
  pcVar16[-3] = '\0';
  pcVar16[-2] = '\0';
  pcVar16[-1] = '\0';
  kv_set_var_nentry_update_test();
  goto LAB_001033ee;
}

Assistant:

void kv_set_var_nentry_update_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    int cmp, i;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string WITH space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    size_t offset_idx = 0;

    // first pass
    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
        kv_ops->set_kv(node, i, &key_ptrs[i], (void *)&v);

        // basic node->data verification
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    freevars(key_ptrs, n);
    key_ptrs = alca(void *, n);
    offset_idx = 0;

    // second pass
    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
        kv_ops->set_kv(node, i, &key_ptrs[i], (void *)&v);

        // basic node->data verification
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    /* swap entries */

    // copy first key to middle
    kv_ops->set_kv(node, n/2, &key_ptrs[0], (void *)&v);
    keys[n/2] = keys[0];

    // copy last key to first
    kv_ops->set_kv(node, 0, &key_ptrs[n-1], (void *)&v);
    keys[0] = keys[n - 1];

    // copy middle key to last
    kv_ops->set_kv(node, n - 1, &key_ptrs[0], (void *)&v);
    keys[n - 1] = keys[n/2];

    // verify
    offset_idx = 0;
    for (i = 0; i < n; i++) {
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    free(node);
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_update_test");
}